

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hrgls_api.hpp
# Opt level: O2

hrgls_Status __thiscall hrgls::API::SetLogMessageStreamingState(API *this,bool running)

{
  API_private *pAVar1;
  mapped_type mVar2;
  pthread_t pVar3;
  mapped_type *pmVar4;
  key_type local_30;
  
  if (this->m_private != (API_private *)0x0) {
    mVar2 = hrgls_APISetLogMessageStreamingState(this->m_private->m_api,running);
    pAVar1 = this->m_private;
    pVar3 = pthread_self();
    local_30._M_thread = pVar3;
    pmVar4 = std::
             map<std::thread::id,_int,_std::less<std::thread::id>,_std::allocator<std::pair<const_std::thread::id,_int>_>_>
             ::operator[](&pAVar1->m_status,&local_30);
    *pmVar4 = mVar2;
    local_30._M_thread = pVar3;
    pmVar4 = std::
             map<std::thread::id,_int,_std::less<std::thread::id>,_std::allocator<std::pair<const_std::thread::id,_int>_>_>
             ::operator[](&this->m_private->m_status,&local_30);
    return *pmVar4;
  }
  return 0x3ee;
}

Assistant:

hrgls_Status API::SetLogMessageStreamingState(bool running)
  {
    if (!m_private) {
      return hrgls_STATUS_NULL_OBJECT_POINTER;
    }
    m_private->m_status[std::this_thread::get_id()] = hrgls_APISetLogMessageStreamingState(m_private->m_api,
      running);
    return m_private->m_status[std::this_thread::get_id()];
  }